

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O3

void __thiscall rengine::StandardSurface::~StandardSurface(StandardSurface *this)

{
  mutex *__mutex;
  Renderer *pRVar1;
  Node *pNVar2;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar3;
  pointer ppBVar4;
  int iVar5;
  
  (this->super_Surface)._vptr_Surface = (_func_int **)&PTR__StandardSurface_001338e8;
  pRVar1 = (this->m_renderer)._M_t.
           super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
           super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
  if ((pRVar1 != (Renderer *)0x0) && (pNVar2 = pRVar1->m_sceneRoot, pNVar2 != (Node *)0x0)) {
    (**(code **)((long)(pNVar2->super_SignalEmitter)._vptr_SignalEmitter + 0x10))();
  }
  __mutex = &(this->m_workQueue).m_mutex;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    (this->m_workQueue).m_running = false;
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::thread::join();
    std::__cxx11::
    _List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
    ::_M_clear(&(this->m_workQueue).m_jobs.
                super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
              );
    std::condition_variable::~condition_variable(&(this->m_workQueue).m_condition);
    if ((this->m_workQueue).m_thread._M_id._M_thread == 0) {
      (this->m_animationManager).super_SignalEmitter._vptr_SignalEmitter =
           (_func_int **)&PTR__AnimationManager_00133a60;
      std::__cxx11::
      _List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
      ::_M_clear(&(this->m_animationManager).m_scheduledAnimations.
                  super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                );
      std::__cxx11::
      _List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
      ::_M_clear(&(this->m_animationManager).m_runningAnimations.
                  super__List_base<rengine::AnimationManager::ManagedAnimation,_std::allocator<rengine::AnimationManager::ManagedAnimation>_>
                );
      (this->m_animationManager).super_SignalEmitter._vptr_SignalEmitter =
           (_func_int **)&PTR__SignalEmitter_00133aa8;
      Signal<>::emit(&SignalEmitter::onDestruction,&(this->m_animationManager).super_SignalEmitter);
      pvVar3 = (this->m_animationManager).super_SignalEmitter.m_buckets;
      if ((pvVar3 != (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                      *)0x0) &&
         (ppBVar4 = (pvVar3->
                    super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                    )._M_impl.super__Vector_impl_data._M_start, ppBVar4 != (pointer)0x0)) {
        operator_delete(ppBVar4);
      }
      operator_delete(pvVar3);
      pRVar1 = (this->m_renderer)._M_t.
               super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>.
               _M_t.
               super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
               super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
      if (pRVar1 != (Renderer *)0x0) {
        (*pRVar1->_vptr_Renderer[1])();
      }
      (this->m_renderer)._M_t.
      super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
      super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
      super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl = (Renderer *)0x0;
      Surface::~Surface(&this->super_Surface);
      return;
    }
  }
  else {
    std::__throw_system_error(iVar5);
  }
  std::terminate();
}

Assistant:

~StandardSurface()
    {
        if (m_renderer) {
            if (m_renderer->sceneRoot())
                m_renderer->sceneRoot()->destroy();
        }
    }